

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O2

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::Sort
          (PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> runs;
  _Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenerateRuns(this,begin,end,(vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *)&local_28);
  Merge(this,begin,(vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *)&local_28);
  std::_Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void Sort(RAI begin, RAI end) {
        std::vector<RunPool<ValueType>*> runs;
        GenerateRuns(begin, end, runs);
        Merge(begin, runs);
    }